

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_RealVect.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *ostr,RealVect *p)

{
  ostream *poVar1;
  
  std::operator<<(ostr,"(");
  poVar1 = std::ostream::_M_insert<double>(p->vect[0]);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(p->vect[1]);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(p->vect[2]);
  std::operator<<(poVar1,")");
  return ostr;
}

Assistant:

std::ostream&
  operator<< (std::ostream& ostr, const RealVect& p)
  {
    ostr << "(" << AMREX_D_TERM ( p[0] ,<< "," << p[1], << "," << p[2]) << ")" ;
    return ostr;
  }